

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsWindowChildOf
               (ImGuiWindow *window,ImGuiWindow *potential_parent,bool popup_hierarchy,
               bool dock_hierarchy)

{
  bool bVar1;
  undefined3 in_register_00000011;
  ImGuiWindow *pIVar2;
  
  pIVar2 = window->RootWindow;
  if (CONCAT31(in_register_00000011,popup_hierarchy) != 0) {
    pIVar2 = pIVar2->RootWindowPopupTree;
  }
  if (dock_hierarchy) {
    pIVar2 = pIVar2->RootWindowDockTree;
  }
  if (pIVar2 != potential_parent) {
    while( true ) {
      bVar1 = window == potential_parent;
      if (window == potential_parent) {
        return bVar1;
      }
      if (window == pIVar2) break;
      window = window->ParentWindow;
      if (window == (ImGuiWindow *)0x0) {
        return bVar1;
      }
    }
    return bVar1;
  }
  return true;
}

Assistant:

bool ImGui::IsWindowChildOf(ImGuiWindow* window, ImGuiWindow* potential_parent, bool popup_hierarchy, bool dock_hierarchy)
{
    ImGuiWindow* window_root = GetCombinedRootWindow(window, popup_hierarchy, dock_hierarchy);
    if (window_root == potential_parent)
        return true;
    while (window != NULL)
    {
        if (window == potential_parent)
            return true;
        if (window == window_root) // end of chain
            return false;
        window = window->ParentWindow;
    }
    return false;
}